

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::StringReplace
               (string *s,string *oldsub,string *newsub,bool replace_all,string *res)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  byte in_CL;
  ulong in_RSI;
  string *in_RDI;
  string *in_R8;
  size_type pos;
  size_type start_pos;
  undefined8 local_30;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_30 = 0;
    do {
      lVar2 = std::__cxx11::string::find(in_RDI,in_RSI);
      if (lVar2 == -1) break;
      std::__cxx11::string::append(in_R8,(ulong)in_RDI,local_30);
      std::__cxx11::string::append(in_R8);
      lVar3 = std::__cxx11::string::size();
      local_30 = lVar2 + lVar3;
    } while ((in_CL & 1) != 0);
    std::__cxx11::string::length();
    std::__cxx11::string::append(in_R8,(ulong)in_RDI,local_30);
  }
  else {
    std::__cxx11::string::append(in_R8);
  }
  return;
}

Assistant:

void StringReplace(const string& s, const string& oldsub,
                   const string& newsub, bool replace_all,
                   string* res) {
  if (oldsub.empty()) {
    res->append(s);  // if empty, append the given string.
    return;
  }

  string::size_type start_pos = 0;
  string::size_type pos;
  do {
    pos = s.find(oldsub, start_pos);
    if (pos == string::npos) {
      break;
    }
    res->append(s, start_pos, pos - start_pos);
    res->append(newsub);
    start_pos = pos + oldsub.size();  // start searching again after the "old"
  } while (replace_all);
  res->append(s, start_pos, s.length() - start_pos);
}